

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall embree::SceneGraph::Node::~Node(Node *this)

{
  pointer pcVar1;
  
  (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__Node_002c23d0;
  if (opaque_geometry_destruction != (code *)0x0) {
    (*opaque_geometry_destruction)(this->geometry);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->fileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->fileName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Node() {
        if (opaque_geometry_destruction)
          opaque_geometry_destruction(geometry);
      }